

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglConfigList.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::ConfigList::iterate(ConfigList *this)

{
  TestLog *this_00;
  Library *egl;
  EGLDisplay display;
  long lVar1;
  EGLint val;
  vector<void_*,_std::allocator<void_*>_> configs;
  string transparentType;
  string surfaceTypes;
  string renderableTypes;
  string conformant;
  string caveat;
  string colorBufferType;
  qpEglConfigInfo info;
  int local_354;
  vector<void_*,_std::allocator<void_*>_> local_350;
  Bitfield<16UL> local_338;
  Bitfield<16UL> local_318;
  TestLog *local_2f0;
  Bitfield<16UL> local_2e8;
  Enum<int,_2UL> local_2c8;
  long local_2b8 [2];
  Enum<int,_2UL> local_2a8;
  long local_298 [2];
  ConfigList *local_288;
  Bitfield<16UL> local_280;
  long *local_268;
  long local_258 [2];
  qpEglConfigInfo local_248;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_288 = this;
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  eglu::getConfigs(&local_350,egl,display);
  local_2f0 = this_00;
  tcu::TestLog::startEglConfigSet(this_00,"EGL-configs","List of all EGL configs");
  if (0 < (int)((ulong)((long)local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    lVar1 = 0;
    do {
      local_354 = 0;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3020,&local_354);
      local_248.bufferSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3024,&local_354);
      local_248.redSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3023,&local_354);
      local_248.greenSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3022,&local_354);
      local_248.blueSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303d,&local_354);
      local_248.luminanceSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3021,&local_354);
      local_248.alphaSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303e,&local_354);
      local_248.alphaMaskSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3039,&local_354);
      local_248.bindToTextureRGB = (deBool)(local_354 == 1);
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303a,&local_354);
      local_248.bindToTextureRGBA = (deBool)(local_354 == 1);
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303f,&local_354);
      local_2a8.m_getName = eglu::getColorBufferTypeName;
      local_2a8.m_value = local_354;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      tcu::Format::Enum<int,_2UL>::toStream(&local_2a8,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.colorBufferType = (char *)local_268;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3027,&local_354);
      local_2c8.m_getName = eglu::getConfigCaveatName;
      local_2c8.m_value = local_354;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      tcu::Format::Enum<int,_2UL>::toStream(&local_2c8,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.configCaveat = (char *)local_2a8.m_getName;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3028,&local_354);
      local_248.configID = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3042,&local_354);
      eglu::getAPIBitsStr(&local_318,local_354);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_2e8.m_end = local_318.m_end;
      local_2e8.m_value = local_318.m_value;
      local_2e8.m_begin = local_318.m_begin;
      tcu::Format::Bitfield<16UL>::toStream(&local_2e8,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.conformant = (char *)local_2c8.m_getName;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3025,&local_354);
      local_248.depthSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3029,&local_354);
      local_248.level = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x302c,&local_354);
      local_248.maxPBufferWidth = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x302a,&local_354);
      local_248.maxPBufferHeight = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x302b,&local_354);
      local_248.maxPBufferPixels = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303c,&local_354);
      local_248.maxSwapInterval = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x303b,&local_354);
      local_248.minSwapInterval = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x302d,&local_354);
      local_248.nativeRenderable = (deBool)(local_354 == 1);
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3040,&local_354);
      eglu::getAPIBitsStr(&local_338,local_354);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_318.m_end = local_338.m_end;
      local_318.m_value = local_338.m_value;
      local_318.m_begin = local_338.m_begin;
      tcu::Format::Bitfield<16UL>::toStream(&local_318,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.renderableType = (char *)local_2e8.m_value;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3032,&local_354);
      local_248.sampleBuffers = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3031,&local_354);
      local_248.samples = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3026,&local_354);
      local_248.stencilSize = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3033,&local_354);
      eglu::getSurfaceBitsStr(&local_280,local_354);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_338.m_end = local_280.m_end;
      local_338.m_begin = (BitDesc *)CONCAT44(local_280.m_begin._4_4_,(int)local_280.m_begin);
      local_338.m_value = local_280.m_value;
      tcu::Format::Bitfield<16UL>::toStream(&local_338,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.surfaceTypes = (char *)local_318.m_value;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3034,&local_354);
      local_280.m_value = (deUint64)eglu::getTransparentTypeName;
      local_280.m_begin._0_4_ = local_354;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_280,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      local_248.transparentType = (char *)local_338.m_value;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3037,&local_354);
      local_248.transparentRedValue = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3036,&local_354);
      local_248.transparentGreenValue = local_354;
      (*egl->_vptr_Library[0x19])
                (egl,display,
                 local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0x3035,&local_354);
      local_248.transparentBlueValue = local_354;
      tcu::TestLog::writeEglConfig(local_2f0,&local_248);
      if ((BitDesc **)local_338.m_value != &local_338.m_end) {
        operator_delete((void *)local_338.m_value,(ulong)((long)&(local_338.m_end)->bit + 1));
      }
      if ((BitDesc **)local_318.m_value != &local_318.m_end) {
        operator_delete((void *)local_318.m_value,(ulong)((long)&(local_318.m_end)->bit + 1));
      }
      if ((BitDesc **)local_2e8.m_value != &local_2e8.m_end) {
        operator_delete((void *)local_2e8.m_value,(ulong)((long)&(local_2e8.m_end)->bit + 1));
      }
      if (local_2c8.m_getName != (GetNameFunc)local_2b8) {
        operator_delete(local_2c8.m_getName,local_2b8[0] + 1);
      }
      if (local_2a8.m_getName != (GetNameFunc)local_298) {
        operator_delete(local_2a8.m_getName,local_298[0] + 1);
      }
      if (local_268 != local_258) {
        operator_delete(local_268,local_258[0] + 1);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)((ulong)((long)local_350.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)local_350.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
  }
  tcu::TestLog::endEglConfigSet(local_2f0);
  (*egl->_vptr_Library[0x34])(egl);
  tcu::TestContext::setTestResult
            ((local_288->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
             ,"");
  if (local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ConfigList::iterate (void)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();
	tcu::TestLog&		log			= m_testCtx.getLog();
	EGLDisplay			display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	vector<EGLConfig>	configs		= eglu::getConfigs(egl, display);

	// \todo [2011-03-23 pyry] Check error codes!

	// \todo [kalle 10/08/2010] Get EGL version.

	log.startEglConfigSet("EGL-configs", "List of all EGL configs");

	// \todo [kalle 10/08/2010] Add validity checks for the values?
	// \todo [kalle 10/08/2010] Adapt for different EGL versions

	for (int i = 0; i < (int)configs.size(); i++)
	{
		qpEglConfigInfo info;
		EGLint val = 0;

		egl.getConfigAttrib(display, configs[i], EGL_BUFFER_SIZE, &val);
		info.bufferSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_RED_SIZE, &val);
		info.redSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_GREEN_SIZE, &val);
		info.greenSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BLUE_SIZE, &val);
		info.blueSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LUMINANCE_SIZE, &val);
		info.luminanceSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_SIZE, &val);
		info.alphaSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_MASK_SIZE, &val);
		info.alphaMaskSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGB, &val);
		info.bindToTextureRGB = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGBA, &val);
		info.bindToTextureRGBA = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_COLOR_BUFFER_TYPE, &val);
		std::string colorBufferType = de::toString(eglu::getColorBufferTypeStr(val));
		info.colorBufferType = colorBufferType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_CAVEAT, &val);
		std::string caveat = de::toString(eglu::getConfigCaveatStr(val));
		info.configCaveat = caveat.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_ID, &val);
		info.configID = val;

		egl.getConfigAttrib(display, configs[i], EGL_CONFORMANT, &val);
		std::string conformant = de::toString(eglu::getAPIBitsStr(val));
		info.conformant = conformant.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_DEPTH_SIZE, &val);
		info.depthSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LEVEL, &val);
		info.level = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_WIDTH, &val);
		info.maxPBufferWidth = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_HEIGHT, &val);
		info.maxPBufferHeight = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_PIXELS, &val);
		info.maxPBufferPixels = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_SWAP_INTERVAL, &val);
		info.maxSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_MIN_SWAP_INTERVAL, &val);
		info.minSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_NATIVE_RENDERABLE, &val);
		info.nativeRenderable = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_RENDERABLE_TYPE, &val);
		std::string renderableTypes = de::toString(eglu::getAPIBitsStr(val));
		info.renderableType = renderableTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLE_BUFFERS, &val);
		info.sampleBuffers = val;

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLES, &val);
		info.samples = val;

		egl.getConfigAttrib(display, configs[i], EGL_STENCIL_SIZE, &val);
		info.stencilSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_SURFACE_TYPE, &val);
		std::string surfaceTypes = de::toString(eglu::getSurfaceBitsStr(val));
		info.surfaceTypes = surfaceTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_TYPE, &val);
		std::string transparentType = de::toString(eglu::getTransparentTypeStr(val));
		info.transparentType = transparentType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_RED_VALUE, &val);
		info.transparentRedValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_GREEN_VALUE, &val);
		info.transparentGreenValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_BLUE_VALUE, &val);
		info.transparentBlueValue = val;

		log.writeEglConfig(&info);
	}
	log.endEglConfigSet();

	egl.terminate(display);

	getTestContext().setTestResult(QP_TEST_RESULT_PASS, "");

	return TestNode::STOP;
}